

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

Maybe<capnp::compiler::Module_&> __thiscall
capnp::SchemaParser::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  long *plVar1;
  ModuleImpl *pMVar2;
  Own<capnp::SchemaFile,_std::nullptr_t> *importedFile;
  Own<capnp::SchemaFile,_std::nullptr_t> local_38;
  Disposer *local_28;
  SchemaFile *local_20;
  
  plVar1 = *(long **)(importPath.content.ptr + 0x18);
  (**(code **)(*plVar1 + 0x10))(&local_28,plVar1,importPath.content.size_);
  local_38.disposer = local_28;
  local_38.ptr = local_20;
  if (local_20 == (SchemaFile *)0x0) {
    (this->super_Module).super_ErrorReporter._vptr_ErrorReporter = (_func_int **)0x0;
  }
  else {
    pMVar2 = getModuleImpl(*(SchemaParser **)(importPath.content.ptr + 8),&local_38);
    (this->super_Module).super_ErrorReporter._vptr_ErrorReporter = (_func_int **)pMVar2;
    if (local_38.ptr != (SchemaFile *)0x0) {
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 (local_38.ptr)->_vptr_SchemaFile[-2] + (long)&(local_38.ptr)->_vptr_SchemaFile);
    }
  }
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    KJ_IF_SOME(importedFile, file->import(importPath)) {
      return parser.getModuleImpl(kj::mv(importedFile));
    } else {
      return kj::none;
    }